

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O2

ImageTemplate<unsigned_char> * __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::generate
          (ImageTemplate<unsigned_char> *__return_storage_ptr__,ImageTemplate<unsigned_char> *this,
          uint32_t width_,uint32_t height_,uint8_t colorCount_,uint8_t alignment_)

{
  ImageTemplate(__return_storage_ptr__,0,0,'\x01','\x01');
  __return_storage_ptr__->_type = this->_type;
  setColorCount(__return_storage_ptr__,colorCount_);
  setAlignment(__return_storage_ptr__,alignment_);
  resize(__return_storage_ptr__,width_,height_);
  return __return_storage_ptr__;
}

Assistant:

ImageTemplate generate( uint32_t width_ = 0u, uint32_t height_ = 0u, uint8_t colorCount_ = 1u, uint8_t alignment_ = 1u ) const
        {
            ImageTemplate image;
            image._type = _type;

            image.setColorCount( colorCount_ );
            image.setAlignment( alignment_ );
            image.resize( width_, height_ );

            return image;
        }